

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_sharing_queue_global_request(ConnectionLayer *cl,ssh_sharing_connstate *cs)

{
  ssh2_queue_global_request_handler
            ((ssh2_connection_state *)&cl[-0xe].vt,ssh2_sharing_globreq_response,cs);
  return;
}

Assistant:

static void ssh2_sharing_queue_global_request(
    ConnectionLayer *cl, ssh_sharing_connstate *cs)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    ssh2_queue_global_request_handler(s, ssh2_sharing_globreq_response, cs);
}